

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmath.c
# Opt level: O0

int logmath_add_exact(logmath_t *lmath,int logb_p,int logb_q)

{
  int iVar1;
  float64 fVar2;
  float64 fVar3;
  int logb_q_local;
  int logb_p_local;
  logmath_t *lmath_local;
  
  fVar2 = logmath_exp(lmath,logb_p);
  fVar3 = logmath_exp(lmath,logb_q);
  iVar1 = logmath_log(lmath,(float64)((double)fVar2 + (double)fVar3));
  return iVar1;
}

Assistant:

int
logmath_add_exact(logmath_t *lmath, int logb_p, int logb_q)
{
    return logmath_log(lmath,
                       logmath_exp(lmath, logb_p)
                       + logmath_exp(lmath, logb_q));
}